

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall r_exec::View::View(View *this,SysView *source,Code *object)

{
  uint64_t uVar1;
  Code *object_local;
  SysView *source_local;
  View *this_local;
  
  r_code::View::View(&this->super_View,source,object);
  (this->super_View).super__Object._vptr__Object = (_func_int **)&PTR__View_002ed5f8;
  core::P<r_exec::Controller>::P(&this->controller,(Controller *)0x0);
  std::mutex::mutex(&this->m_groupMutex);
  uVar1 = GetOID();
  *(int *)&(this->super_View).field_0x58 = (int)uVar1;
  reset(this);
  return;
}

Assistant:

View::View(r_code::SysView *source, r_code::Code *object): r_code::View(source, object), controller(nullptr)
{
    _code[VIEW_OID].atom = GetOID();
    reset();
}